

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O2

int Res_SatSimulate(Res_Sim_t *p,int nPatsLimit,int fOnSet)

{
  uint *puVar1;
  Vec_Ptr_t *p_00;
  int iVar2;
  abctime aVar3;
  sat_solver *s;
  uint *__ptr;
  lit *begin;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  abctime aVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint i;
  long lVar11;
  int iVar12;
  bool bVar13;
  
  aVar3 = Abc_Clock();
  Abc_NtkPo(p->pAig,1);
  iVar12 = (&p->nPats0)[fOnSet != 0];
  if (nPatsLimit <= iVar12) {
    __assert_fail("iPat < nPatsLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resSat.c"
                  ,0xeb,"int Res_SatSimulate(Res_Sim_t *, int, int)");
  }
  p_00 = (&p->vPats0)[fOnSet != 0];
  s = (sat_solver *)Res_SatSimulateConstr(p->pAig,fOnSet);
  s->fSkipSimplify = 1;
  iVar2 = sat_solver_simplify(s);
  if (iVar2 == 0) {
    uVar9 = -(uint)(iVar12 != 0);
  }
  else {
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 0x20;
    __ptr[1] = 0;
    begin = (lit *)malloc(0x80);
    *(lit **)(__ptr + 2) = begin;
    while( true ) {
      uVar9 = 1;
      if (nPatsLimit <= iVar12) break;
      iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
      if (iVar2 != 1) {
        if (iVar2 == -1) {
          uVar9 = 1;
          if (iVar12 == 0) {
            if (fOnSet == 0) {
              p->fConst1 = 1;
            }
            else {
              p->fConst0 = 1;
            }
            iVar12 = 0;
            uVar9 = 0;
          }
        }
        else {
          uVar9 = (uint)(iVar12 != 0);
        }
        break;
      }
      __ptr[1] = 0;
      uVar9 = 0;
      lVar11 = 0;
      lVar7 = 0;
      while (i = (uint)lVar11, (int)i < p->nTruePis) {
        pAVar4 = Abc_NtkPi(p->pAig,i);
        uVar10 = (pAVar4->field_6).iTemp;
        if (((int)uVar10 < 0) || (s->size <= (int)uVar10)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
        }
        bVar13 = s->model[uVar10 & 0x7fffffff] == 1;
        if (bVar13) {
          pvVar5 = Vec_PtrEntry(p_00,i);
          puVar1 = (uint *)((long)pvVar5 + (long)(iVar12 >> 5) * 4);
          *puVar1 = *puVar1 | 1 << ((byte)iVar12 & 0x1f);
        }
        if (i == *__ptr) {
          uVar8 = uVar9;
          if (i < 0x10) {
            uVar8 = 0x10;
          }
          if (i < uVar8) {
            if (begin == (lit *)0x0) {
              begin = (lit *)malloc((ulong)uVar8 << 2);
            }
            else {
              begin = (lit *)realloc(begin,(ulong)uVar8 << 2);
            }
            *(lit **)(__ptr + 2) = begin;
            if (begin == (lit *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *__ptr = uVar8;
          }
        }
        begin[lVar11] = (uint)bVar13 + uVar10 * 2;
        lVar11 = lVar11 + 1;
        __ptr[1] = (uint)lVar11;
        lVar7 = lVar7 + -4;
        uVar9 = uVar9 + 2;
      }
      iVar2 = sat_solver_addclause(s,begin,(lit *)((long)begin - lVar7));
      iVar12 = iVar12 + 1;
      uVar9 = 1;
      if (iVar2 == 0) break;
    }
    free(begin);
    free(__ptr);
    if (fOnSet == 0) {
      p->nPats0 = iVar12;
    }
    else {
      p->nPats1 = iVar12;
    }
  }
  sat_solver_delete(s);
  aVar6 = Abc_Clock();
  p->timeSat = p->timeSat + (aVar6 - aVar3);
  return uVar9;
}

Assistant:

int Res_SatSimulate( Res_Sim_t * p, int nPatsLimit, int fOnSet )
{
    Vec_Int_t * vLits;
    Vec_Ptr_t * vPats;
    sat_solver * pSat;
    int RetValue = -1; // Suppress "might be used uninitialized"
    int i, k, value, status, Lit, Var, iPat;
    abctime clk = Abc_Clock();

//printf( "Looking for %s:  ", fOnSet? "onset " : "offset" );

    // decide what problem should be solved
    Lit = toLitCond( (int)(ABC_PTRUINT_T)Abc_NtkPo(p->pAig,1)->pCopy, !fOnSet );
    if ( fOnSet )
    {
        iPat = p->nPats1;
        vPats = p->vPats1;
    }
    else
    {
        iPat = p->nPats0;
        vPats = p->vPats0;
    }
    assert( iPat < nPatsLimit );

    // derive the SAT solver
    pSat = (sat_solver *)Res_SatSimulateConstr( p->pAig, fOnSet );
    pSat->fSkipSimplify = 1;
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        if ( iPat == 0 )
        {
//            if ( fOnSet )
//                p->fConst0 = 1;
//            else
//                p->fConst1 = 1;
            RetValue = 0;
        }
        goto finish;
    }
 
    // enumerate through the SAT assignments
    RetValue = 1;
    vLits = Vec_IntAlloc( 32 );
    for ( k = iPat; k < nPatsLimit; k++ )
    {
        // solve with the assumption
//        status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_False )
        {
//printf( "Const %d\n", !fOnSet );
            if ( k == 0 )
            {
                if ( fOnSet )
                    p->fConst0 = 1;
                else
                    p->fConst1 = 1;
                RetValue = 0;
            }
            break;
        }
        else if ( status == l_True )
        {
            // save the pattern
            Vec_IntClear( vLits );
            for ( i = 0; i < p->nTruePis; i++ )
            {
                Var = (int)(ABC_PTRUINT_T)Abc_NtkPi(p->pAig,i)->pCopy;
//                value = (int)(pSat->model.ptr[Var] == l_True);
                value = sat_solver_var_value(pSat, Var);
                if ( value )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(vPats, i), k );
                Lit = toLitCond( Var, value );
                Vec_IntPush( vLits, Lit );
//                printf( "%d", value );
            }
//            printf( "\n" );

            status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            if ( status == 0 )
            {
                k++;
                RetValue = 1; 
                break;
            }
        }
        else
        {
//printf( "Undecided\n" );
            if ( k == 0 )
                RetValue = 0;
            else
                RetValue = 1; 
            break;
        }
    }
    Vec_IntFree( vLits );
//printf( "Found %d patterns\n", k - iPat );

    // set the new number of patterns
    if ( fOnSet )
        p->nPats1 = k;
    else
        p->nPats0 = k;

finish:

    sat_solver_delete( pSat );
p->timeSat += Abc_Clock() - clk;
    return RetValue;
}